

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * monty_pow(MontyContext *mc,mp_int *base,mp_int *exponent)

{
  bool bVar1;
  uint uVar2;
  mp_int *pmVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  ulong uVar6;
  ulong local_178;
  size_t i_2;
  size_t j_2;
  ulong uStack_160;
  uint not_this_one;
  size_t j_1;
  size_t j;
  uint table_index;
  _Bool first_iteration;
  size_t i;
  mp_int *table_entry;
  mp_int *out;
  size_t i_1;
  mp_int *table [32];
  mp_int *exponent_local;
  mp_int *base_local;
  MontyContext *mc_local;
  
  pmVar3 = monty_identity(mc);
  pmVar3 = mp_copy(pmVar3);
  for (out = (mp_int *)0x1; out < (mp_int *)0x20; out = (mp_int *)((long)&out->nw + 1)) {
    pmVar4 = monty_mul(mc,table[(long)((long)&out[-1].w + 6)],base);
    table[(long)((long)&out[-1].w + 7)] = pmVar4;
  }
  pmVar4 = mp_make_sized(mc->rw);
  pmVar5 = monty_identity(mc);
  mp_copy_into(pmVar4,pmVar5);
  pmVar5 = mp_make_sized(mc->rw);
  uVar6 = exponent->nw * 0x40 - 1;
  _table_index = uVar6 - uVar6 % 5;
  bVar1 = true;
  while( true ) {
    j._0_4_ = 0;
    for (j_1 = 0; j_1 < 5; j_1 = j_1 + 1) {
      uVar2 = mp_get_bit(exponent,_table_index + j_1);
      j._0_4_ = uVar2 << ((byte)j_1 & 0x1f) | (uint)j;
    }
    mp_copy_into(pmVar5,pmVar3);
    for (uStack_160 = 1; uStack_160 < 0x20; uStack_160 = uStack_160 + 1) {
      mp_select_into(pmVar5,table[uStack_160 - 1],pmVar5,(uint)(((uint)j ^ uStack_160) + 0x1f >> 5))
      ;
    }
    if (bVar1) {
      mp_copy_into(pmVar4,pmVar5);
      bVar1 = false;
    }
    else {
      monty_mul_into(mc,pmVar4,pmVar4,pmVar5);
    }
    if (_table_index == 0) break;
    for (i_2 = 0; i_2 < 5; i_2 = i_2 + 1) {
      monty_mul_into(mc,pmVar4,pmVar4,pmVar4);
    }
    _table_index = _table_index + -5;
  }
  for (local_178 = 0; local_178 < 0x20; local_178 = local_178 + 1) {
    mp_free(table[local_178 - 1]);
  }
  mp_free(pmVar5);
  mp_clear(mc->scratch);
  return pmVar4;
}

Assistant:

mp_int *monty_pow(MontyContext *mc, mp_int *base, mp_int *exponent)
{
    /*
     * Modular exponentiation is done from the top down, using a
     * fixed-window technique.
     *
     * We have a table storing every power of the base from base^0 up
     * to base^{w-1}, where w is a small power of 2, say 2^k. (k is
     * defined above as MODPOW_LOG2_WINDOW_SIZE, and w = 2^k is
     * defined as MODPOW_WINDOW_SIZE.)
     *
     * We break the exponent up into k-bit chunks, from the bottom up,
     * that is
     *
     *   exponent = c_0 + 2^k c_1 + 2^{2k} c_2 + ... + 2^{nk} c_n
     *
     * and we compute base^exponent by computing in turn
     *
     *   base^{c_n}
     *   base^{2^k c_n + c_{n-1}}
     *   base^{2^{2k} c_n + 2^k c_{n-1} + c_{n-2}}
     *   ...
     *
     * where each line is obtained by raising the previous line to the
     * power 2^k (i.e. squaring it k times) and then multiplying in
     * a value base^{c_i}, which we can look up in our table.
     *
     * Side-channel considerations: the exponent is secret, so
     * actually doing a single table lookup by using a chunk of
     * exponent bits as an array index would be an obvious leak of
     * secret information into the cache. So instead, in each
     * iteration, we read _all_ the table entries, and do a sequence
     * of mp_select operations to leave just the one we wanted in the
     * variable that will go into the multiplication. In other
     * contexts (like software AES) that technique is so prohibitively
     * slow that it makes you choose a strategy that doesn't use table
     * lookups at all (we do bitslicing in preference); but here, this
     * iteration through 2^k table elements is replacing k-1 bignum
     * _multiplications_ that you'd have to use instead if you did
     * simple square-and-multiply, and that makes it still a win.
     */

    /* Table that holds base^0, ..., base^{w-1} */
    mp_int *table[MODPOW_WINDOW_SIZE];
    table[0] = mp_copy(monty_identity(mc));
    for (size_t i = 1; i < MODPOW_WINDOW_SIZE; i++)
        table[i] = monty_mul(mc, table[i-1], base);

    /* out accumulates the output value */
    mp_int *out = mp_make_sized(mc->rw);
    mp_copy_into(out, monty_identity(mc));

    /* table_entry will hold each value we get out of the table */
    mp_int *table_entry = mp_make_sized(mc->rw);

    /* Bit index of the chunk of bits we're working on. Start with the
     * highest multiple of k strictly less than the size of our
     * bignum, i.e. the highest-index chunk of bits that might
     * conceivably contain any nonzero bit. */
    size_t i = (exponent->nw * BIGNUM_INT_BITS) - 1;
    i -= i % MODPOW_LOG2_WINDOW_SIZE;

    bool first_iteration = true;

    while (true) {
        /* Construct the table index */
        unsigned table_index = 0;
        for (size_t j = 0; j < MODPOW_LOG2_WINDOW_SIZE; j++)
            table_index |= mp_get_bit(exponent, i+j) << j;

        /* Iterate through the table to do a side-channel-safe lookup,
         * ending up with table_entry = table[table_index] */
        mp_copy_into(table_entry, table[0]);
        for (size_t j = 1; j < MODPOW_WINDOW_SIZE; j++) {
            unsigned not_this_one =
                ((table_index ^ j) + MODPOW_WINDOW_SIZE - 1)
                >> MODPOW_LOG2_WINDOW_SIZE;
            mp_select_into(table_entry, table[j], table_entry, not_this_one);
        }

        if (!first_iteration) {
            /* Multiply into the output */
            monty_mul_into(mc, out, out, table_entry);
        } else {
            /* On the first iteration, we can save one multiplication
             * by just copying */
            mp_copy_into(out, table_entry);
            first_iteration = false;
        }

        /* If that was the bottommost chunk of bits, we're done */
        if (i == 0)
            break;

        /* Otherwise, square k times and go round again. */
        for (size_t j = 0; j < MODPOW_LOG2_WINDOW_SIZE; j++)
            monty_mul_into(mc, out, out, out);

        i-= MODPOW_LOG2_WINDOW_SIZE;
    }

    for (size_t i = 0; i < MODPOW_WINDOW_SIZE; i++)
        mp_free(table[i]);
    mp_free(table_entry);
    mp_clear(mc->scratch);
    return out;
}